

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O1

void UnRegisterModule(nodecontext *p,nodemodule *Module,bool_t IncludingModule)

{
  array *p_00;
  thisnode p_01;
  nodeclass *Class;
  char *pcVar1;
  char *pcVar2;
  long *plVar3;
  node *Node;
  
  if (7 < (p->NodeSingleton)._Used) {
    p_00 = &p->NodeSingleton;
    pcVar1 = p_00->_Begin;
    pcVar2 = pcVar1;
    do {
      p_01 = *(thisnode *)pcVar2;
      if (*(nodemodule **)(*(long *)((long)p_01 + 8) + -0x38) == Module) {
        ArrayDelete(p_00,(long)pcVar2 - (long)pcVar1,8);
        Node_Release(p_01);
        pcVar2 = p_00->_Begin + -8;
      }
      pcVar2 = pcVar2 + 8;
      pcVar1 = (p->NodeSingleton)._Begin;
    } while (pcVar2 != pcVar1 + ((p->NodeSingleton)._Used & 0xfffffffffffffff8));
  }
  if (((nodecontext *)Module != p) && ((Module->Base).RefCount != 1)) {
    __assert_fail("Module==&p->Base || Module->Base.RefCount==1",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/node/node.c"
                  ,0x188,"void UnRegisterModule(nodecontext *, nodemodule *, bool_t)");
  }
  if (7 < (p->NodeClass)._Used) {
    plVar3 = (long *)(p->NodeClass)._Begin;
    do {
      Class = (nodeclass *)*plVar3;
      if ((Class->Meta != (nodemeta *)0x0) && (Class->Module == Module)) {
        if ('\0' < Class->State) {
          UnInitClass(p,Class,IncludingModule);
        }
        *(undefined8 *)(*plVar3 + 8) = 0;
      }
      plVar3 = plVar3 + 1;
    } while (plVar3 != (long *)((p->NodeClass)._Begin + ((p->NodeClass)._Used & 0xfffffffffffffff8))
            );
  }
  return;
}

Assistant:

static void UnRegisterModule(nodecontext* p, nodemodule* Module, bool_t IncludingModule)
{
    nodeclass** i;
    node** j;

    // release singleton objects
    for (j=ARRAYBEGIN(p->NodeSingleton,node*);j!=ARRAYEND(p->NodeSingleton,node*);++j)
    {
        if (NodeGetClass(*j)->Module == Module)
        {
            node* Node = *j;
            ArrayDelete(&p->NodeSingleton,(uint8_t*)j-ARRAYBEGIN(p->NodeSingleton,uint8_t),sizeof(node*));
            Node_Release(Node);
            j = ARRAYBEGIN(p->NodeSingleton,node*)-1;
        }
    }

    // node memory leak in this module? (root module checked in NodeContext_Done)
    assert(Module==&p->Base || Module->Base.RefCount==1);

    for (i=ARRAYBEGIN(p->NodeClass,nodeclass*);i!=ARRAYEND(p->NodeClass,nodeclass*);++i)
        if ((*i)->Meta && (*i)->Module == Module)
        {
            if ((*i)->State>=CLASS_INITED)
                UnInitClass(p,(*i),IncludingModule);
            (*i)->Meta = NULL;
        }
}